

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Vec_Str_t * Lms_GiaAreas(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  size_t __size;
  
  iVar4 = p->vCos->nSize;
  pVVar5 = (Vec_Str_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar8 = iVar4;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)malloc((long)iVar8);
  }
  pVVar5->pArray = pcVar6;
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      iVar4 = pVVar7->pArray[lVar11];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar5;
      }
      pGVar1 = p->pObjs + iVar4;
      uVar9 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if ((~*(uint *)(pGVar1 + -uVar9) & 0x1fffffff) == 0 || (int)*(uint *)(pGVar1 + -uVar9) < 0) {
        cVar10 = '\0';
      }
      else {
        iVar4 = Lms_ObjArea(pGVar1 + -uVar9);
        cVar10 = (char)iVar4;
      }
      uVar2 = pVVar5->nSize;
      uVar3 = pVVar5->nCap;
      if (uVar2 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar5->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
          }
          __size = 0x10;
        }
        else {
          __size = (ulong)uVar3 * 2;
          if ((int)__size <= (int)uVar3) goto LAB_00286721;
          if (pVVar5->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(__size);
          }
          else {
            pcVar6 = (char *)realloc(pVVar5->pArray,__size);
          }
        }
        pVVar5->pArray = pcVar6;
        pVVar5->nCap = (int)__size;
      }
LAB_00286721:
      pVVar5->nSize = uVar2 + 1;
      pVVar5->pArray[(int)uVar2] = cVar10;
      lVar11 = lVar11 + 1;
      pVVar7 = p->vCos;
    } while (lVar11 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Str_t * Lms_GiaAreas( Gia_Man_t * p )
{
    Vec_Str_t * vAreas;
    Gia_Obj_t * pObj;
    int i;
    vAreas = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vAreas, (char)(Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) ? Lms_ObjArea(Gia_ObjFanin0(pObj)) : 0) );
    return vAreas;
}